

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  __pthread_internal_list *p_Var1;
  bool bVar2;
  bool bVar3;
  CppType CVar4;
  int iVar5;
  FastFieldValuePrinter *pFVar6;
  Message *message_00;
  int j;
  ulong uVar7;
  char *pcVar8;
  __pthread_internal_list *p_Var9;
  undefined1 local_d0 [8];
  DynamicMessageFactory factory;
  undefined1 auStack_78 [8];
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  uint local_38;
  
  if ((((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x3c) == 3)) &&
      (CVar4 = FieldDescriptor::cpp_type(field), CVar4 != CPPTYPE_STRING)) &&
     (CVar4 = FieldDescriptor::cpp_type(field), CVar4 != CPPTYPE_MESSAGE)) {
    PrintShortRepeatedField(this,message,reflection,field,generator);
    return;
  }
  if (*(int *)(field + 0x3c) == 3) {
    local_38 = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar2 = Reflection::HasField(reflection,message,field);
    if ((bVar2) ||
       (local_38 = 0, *(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\x01')) {
      local_38 = 1;
    }
  }
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_d0);
  auStack_78 = (undefined1  [8])0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = FieldDescriptor::is_map(field);
  p_Var9 = (__pthread_internal_list *)0x0;
  bVar3 = false;
  if (bVar2) {
    bVar3 = internal::MapFieldPrinterHelper::SortMap
                      (message,reflection,field,(MessageFactory *)local_d0,
                       (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        *)auStack_78);
  }
  factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  if (0 < (int)local_38) {
    factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)(ulong)local_38;
  }
  for (; factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next != p_Var9;
      p_Var9 = (__pthread_internal_list *)((long)&p_Var9->__prev + 1)) {
    p_Var1 = (__pthread_internal_list *)0xffffffffffffffff;
    if (*(int *)(field + 0x3c) == 3) {
      p_Var1 = p_Var9;
    }
    PrintFieldName(this,message,(int)p_Var1,local_38,reflection,field,generator);
    CVar4 = FieldDescriptor::cpp_type(field);
    if (CVar4 == CPPTYPE_MESSAGE) {
      pFVar6 = GetFieldPrinter(this,field);
      if (*(int *)(field + 0x3c) == 3) {
        if (bVar2) {
          message_00 = *(pointer)((long)auStack_78 + p_Var9 * 8);
        }
        else {
          message_00 = Reflection::GetRepeatedMessage(reflection,message,field,(int)p_Var9);
        }
      }
      else {
        message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
      }
      (*pFVar6->_vptr_FastFieldValuePrinter[0xe])
                (pFVar6,message_00,(ulong)p_Var1 & 0xffffffff,(ulong)local_38,
                 (ulong)this->single_line_mode_,generator);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
      iVar5 = (*pFVar6->_vptr_FastFieldValuePrinter[0xf])
                        (pFVar6,message_00,(ulong)p_Var1 & 0xffffffff,(ulong)local_38,
                         (ulong)this->single_line_mode_,generator);
      if ((char)iVar5 == '\0') {
        Print(this,message_00,generator);
      }
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
      (*pFVar6->_vptr_FastFieldValuePrinter[0x10])
                (pFVar6,message_00,(ulong)p_Var1 & 0xffffffff,(ulong)local_38,
                 (ulong)this->single_line_mode_,generator);
    }
    else {
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
      PrintFieldValue(this,message,reflection,field,(int)p_Var1,generator);
      pcVar8 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar8 = " ";
      }
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar8,1);
    }
  }
  if (bVar3 != false) {
    for (uVar7 = 0;
        uVar7 < (ulong)((long)sorted_map_field.
                              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3);
        uVar7 = uVar7 + 1) {
      if (*(pointer)((long)auStack_78 + uVar7 * 8) != (Message *)0x0) {
        (*((*(pointer)((long)auStack_78 + uVar7 * 8))->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
  }
  std::
  _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~_Vector_base((_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   *)auStack_78);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_d0);
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  DynamicMessageFactory factory;
  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &factory, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      if (!printer->PrintMessageContent(sub_message, field_index, count,
                                        single_line_mode_, generator)) {
        Print(sub_message, generator);
      }
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintLiteral(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (int j = 0; j < sorted_map_field.size(); ++j) {
      delete sorted_map_field[j];
    }
  }
}